

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O0

void __thiscall
parser::BracketNotationParser<label::StringLabel>::parse_collection
          (BracketNotationParser<label::StringLabel> *this,
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
          *trees_collection,string *file_path)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this_00;
  istream *piVar3;
  Node<label::StringLabel> local_2d8;
  undefined1 local_2a0 [8];
  string tree_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_228;
  ifstream trees_file;
  string *file_path_local;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  *trees_collection_local;
  BracketNotationParser<label::StringLabel> *this_local;
  
  std::ifstream::ifstream(&local_228,file_path,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    tree_string.field_2._M_local_buf[0xf] = '\x01';
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_278,"ERROR: Problem with opening the file \'",file_path);
    std::operator+(&local_258,&local_278,"\' in BracketNotationParser::parse_collection_efficient.")
    ;
    std::runtime_error::runtime_error(this_00,(string *)&local_258);
    tree_string.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)local_2a0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_228,(string *)local_2a0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    bVar2 = validate_input(this,(string *)local_2a0);
    if (bVar2) {
      parse_single(&local_2d8,this,(string *)local_2a0);
      std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
      ::push_back(trees_collection,&local_2d8);
      node::Node<label::StringLabel>::~Node(&local_2d8);
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)local_2a0);
  std::ifstream::~ifstream(&local_228);
  return;
}

Assistant:

void BracketNotationParser<Label>::parse_collection(
    std::vector<node::Node<Label>>& trees_collection,
    const std::string& file_path) {
  std::ifstream trees_file(file_path);
  if (!trees_file) {
    throw std::runtime_error("ERROR: Problem with opening the file '" + file_path + "' in BracketNotationParser::parse_collection_efficient.");
  }
  // Read the trees line by line, parse, and move into the container.
  std::string tree_string;
  while (std::getline(trees_file, tree_string)) {
    if (!validate_input(tree_string)) {
      continue;
    }
    trees_collection.push_back(parse_single(tree_string)); // -> This invokes a move constructor (due to push_back(<rvalue>)).
  }
  trees_file.close();
}